

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O2

size_t green_poller_done(green_poller_t poller)

{
  ulong uVar1;
  char *pcVar2;
  undefined8 uVar3;
  
  if (poller == (green_poller_t)0x0) {
    return 0;
  }
  if (poller->loop == (green_loop_t_conflict)0x0) {
    pcVar2 = "poller->loop != ((void*)0)";
    uVar3 = 0x1a2;
  }
  else {
    uVar1 = poller->used;
    if (poller->size < uVar1) {
      pcVar2 = "poller->size >= poller->used";
      uVar3 = 0x1a3;
    }
    else {
      if (poller->busy <= uVar1) {
        return uVar1 - poller->busy;
      }
      pcVar2 = "poller->used >= poller->busy";
      uVar3 = 0x1a4;
    }
  }
  fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n",pcVar2,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
          ,uVar3);
  fflush(_stderr);
  abort();
}

Assistant:

size_t green_poller_done(green_poller_t poller)
{
    if (poller == NULL) {
        return 0;
    }
    green_assert(poller->loop != NULL);
    green_assert(poller->size >= poller->used);
    green_assert(poller->used >= poller->busy);
    return poller->used - poller->busy;
}